

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O1

void swrenderer::R_DrawMaskedSingle(bool renew)

{
  vissprite_t *spr;
  drawseg_t *pdVar1;
  drawseg_t *ds;
  long lVar2;
  
  if (0 < (long)vsprcount) {
    lVar2 = (long)vsprcount + 1;
    do {
      spr = *(vissprite_t **)(spritesorter + -0x10 + lVar2 * 8);
      if (spr->CurrentPortalUniq == CurrentPortalUniq) {
        R_DrawSprite(spr);
      }
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  if (renew) {
    fake3D._0_1_ = (byte)fake3D | 4;
  }
  pdVar1 = ds_p;
  if (firstdrawseg < ds_p) {
    do {
      ds = pdVar1 + -1;
      if (((pdVar1[-1].CurrentPortalUniq == CurrentPortalUniq) && (pdVar1[-1].fake == 0)) &&
         ((pdVar1[-1].maskedtexturecol != -1 || (pdVar1[-1].bFogBoundary != '\0')))) {
        R_RenderMaskedSegRange(ds,(int)pdVar1[-1].x1,(int)pdVar1[-1].x2);
      }
      pdVar1 = ds;
    } while (firstdrawseg < ds);
  }
  return;
}

Assistant:

void R_DrawMaskedSingle (bool renew)
{
	drawseg_t *ds;
	int i;

#if 0
	R_SplitVisSprites ();
#endif

	for (i = vsprcount; i > 0; i--)
	{
		if (spritesorter[i-1]->CurrentPortalUniq != CurrentPortalUniq)
			continue; // probably another time
		R_DrawSprite (spritesorter[i-1]);
	}

	// render any remaining masked mid textures

	// Modified by Lee Killough:
	// (pointer check was originally nonportable
	// and buggy, by going past LEFT end of array):

	//		for (ds=ds_p-1 ; ds >= drawsegs ; ds--)    old buggy code

	if (renew)
	{
		fake3D |= FAKE3D_REFRESHCLIP;
	}
	for (ds = ds_p; ds-- > firstdrawseg; )	// new -- killough
	{
		// [ZZ] the same as above
		if (ds->CurrentPortalUniq != CurrentPortalUniq)
			continue;
		// kg3D - no fake segs
		if (ds->fake) continue;
		if (ds->maskedtexturecol != -1 || ds->bFogBoundary)
		{
			R_RenderMaskedSegRange (ds, ds->x1, ds->x2);
		}
	}
}